

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.h
# Opt level: O0

Shape * __thiscall
Shape::rotate(Shape *this,double degreeZ,Point<double> *center,double degreeX,double degreeY)

{
  int local_34;
  int i;
  double degreeY_local;
  double degreeX_local;
  Point<double> *center_local;
  double degreeZ_local;
  Shape *this_local;
  
  for (local_34 = 0; local_34 < this->size; local_34 = local_34 + 1) {
    Polygon::rotate(degreeZ,(Point_conflict1 *)(this->polygons + (long)local_34 * 0x50),degreeX,
                    degreeY);
  }
  Point<double>::rotate(&this->center,degreeZ,center,degreeX,degreeY);
  return this;
}

Assistant:

Shape& rotate(double degreeZ, const Point<double>& center = Point<double>(0, 0), double degreeX = 0, double degreeY = 0) {
    for (int i = 0; i < size; ++i) {
      polygons[i].rotate(degreeZ, center, degreeX, degreeY);
    }
    this->center.rotate(degreeZ, center, degreeX, degreeY);
    
    return *this;
  }